

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMergingMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  uint uVar2;
  pointer ppFVar3;
  bool bVar4;
  Type TVar5;
  mapped_type *pmVar6;
  FieldGeneratorBase *pFVar7;
  Descriptor *pDVar8;
  uint i_00;
  uint extraout_EDX;
  uint i_01;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar9;
  FieldDescriptor *extraout_RDX_00;
  int j;
  Printer *pPVar10;
  char *text;
  int i_1;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int i;
  long lVar14;
  allocator local_b9;
  MessageGenerator *local_b8;
  Printer *local_b0;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8 = this;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  class_name_abi_cxx11_((string *)&generator,this);
  std::__cxx11::string::string((string *)&local_80,"class_name",&local_b9);
  local_b0 = printer;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_80);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&generator);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&generator);
  pPVar10 = local_b0;
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_b8->super_SourceGeneratorBase,local_b0);
  io::Printer::Print(pPVar10,&vars,"public void MergeFrom($class_name$ other) {\n");
  io::Printer::Indent(pPVar10);
  io::Printer::Print(pPVar10,"if (other == null) {\n  return;\n}\n");
  lVar12 = 0;
  for (lVar14 = 0; pDVar8 = local_b8->descriptor_, lVar14 < *(int *)(pDVar8 + 0x2c);
      lVar14 = lVar14 + 1) {
    if (*(long *)(*(long *)(pDVar8 + 0x30) + 0x60 + lVar12) == 0) {
      generator.ptr_ =
           CreateFieldGeneratorInternal
                     (local_b8,(FieldDescriptor *)(*(long *)(pDVar8 + 0x30) + lVar12));
      pFVar7 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
               operator->(&generator);
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[6])(pFVar7,local_b0);
      if (generator.ptr_ != (FieldGeneratorBase *)0x0) {
        (*((generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
      }
    }
    lVar12 = lVar12 + 0xa8;
  }
  pPVar10 = local_b0;
  for (lVar12 = 0; lVar12 < *(int *)(pDVar8 + 0x38); lVar12 = lVar12 + 1) {
    lVar13 = lVar12 * 0x30;
    UnderscoresToCamelCase
              ((string *)&generator,*(string **)(*(long *)(pDVar8 + 0x40) + lVar13),false);
    std::__cxx11::string::string((string *)&local_80,"name",&local_b9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&generator);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&generator);
    UnderscoresToCamelCase
              ((string *)&generator,*(string **)(*(long *)(local_b8->descriptor_ + 0x40) + lVar13),
               true);
    std::__cxx11::string::string((string *)&local_80,"property_name",&local_b9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&generator);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&generator);
    io::Printer::Print(pPVar10,&vars,"switch (other.$property_name$Case) {\n");
    io::Printer::Indent(pPVar10);
    pFVar9 = extraout_RDX;
    for (lVar14 = 0; pPVar10 = local_b0,
        lVar14 < *(int *)(*(long *)(local_b8->descriptor_ + 0x40) + 0x1c + lVar13);
        lVar14 = lVar14 + 1) {
      GetPropertyName_abi_cxx11_
                ((string *)&generator,
                 *(csharp **)
                  (*(long *)(*(long *)(local_b8->descriptor_ + 0x40) + lVar13 + 0x20) + lVar14 * 8),
                 pFVar9);
      std::__cxx11::string::string((string *)&local_80,"field_property_name",&local_b9);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_80);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&generator);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&generator);
      io::Printer::Print(local_b0,&vars,
                         "case $property_name$OneofCase.$field_property_name$:\n  $field_property_name$ = other.$field_property_name$;\n  break;\n"
                        );
      pFVar9 = extraout_RDX_00;
    }
    io::Printer::Outdent(local_b0);
    io::Printer::Print(pPVar10,"}\n\n");
    pDVar8 = local_b8->descriptor_;
  }
  io::Printer::Outdent(pPVar10);
  io::Printer::Print(pPVar10,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_b8->super_SourceGeneratorBase,pPVar10);
  io::Printer::Print(pPVar10,"public void MergeFrom(pb::CodedInputStream input) {\n");
  io::Printer::Indent(pPVar10);
  io::Printer::Print(pPVar10,"uint tag;\nwhile ((tag = input.ReadTag()) != 0) {\n  switch(tag) {\n")
  ;
  io::Printer::Indent(pPVar10);
  io::Printer::Indent(pPVar10);
  bVar4 = IsDescriptorOptionMessage(local_b8->descriptor_);
  text = "default:\n  input.SkipLastField();\n  break;\n";
  if (bVar4) {
    text = "default:\n  CustomOptions = CustomOptions.ReadOrSkipUnknownField(input);\n  break;\n";
  }
  io::Printer::Print(pPVar10,text);
  for (uVar11 = 0; pPVar10 = local_b0,
      ppFVar3 = (local_b8->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(local_b8->fields_by_number_).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3);
      uVar11 = uVar11 + 1) {
    pFVar9 = ppFVar3[uVar11];
    TVar5 = FieldDescriptor::type(pFVar9);
    iVar1 = *(int *)(pFVar9 + 0x38);
    uVar2 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar5 * 4);
    bVar4 = FieldDescriptor::is_packable(pFVar9);
    i_01 = i_00;
    if (bVar4) {
      SimpleItoa_abi_cxx11_
                ((string *)&generator,(protobuf *)(ulong)(*(int *)(pFVar9 + 0x38) * 8 + 2),i_00);
      io::Printer::Print(local_b0,"case $packed_tag$:\n","packed_tag",(string *)&generator);
      std::__cxx11::string::~string((string *)&generator);
      i_01 = extraout_EDX;
    }
    SimpleItoa_abi_cxx11_((string *)&generator,(protobuf *)(ulong)(iVar1 << 3 | uVar2),i_01);
    pPVar10 = local_b0;
    io::Printer::Print(local_b0,"case $tag$: {\n","tag",(string *)&generator);
    std::__cxx11::string::~string((string *)&generator);
    io::Printer::Indent(pPVar10);
    generator.ptr_ = CreateFieldGeneratorInternal(local_b8,pFVar9);
    pFVar7 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&generator);
    pPVar10 = local_b0;
    (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar7,local_b0);
    io::Printer::Print(pPVar10,"break;\n");
    io::Printer::Outdent(pPVar10);
    io::Printer::Print(pPVar10,"}\n");
    if (generator.ptr_ != (FieldGeneratorBase *)0x0) {
      (*((generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
    }
  }
  io::Printer::Outdent(local_b0);
  io::Printer::Print(pPVar10,"}\n");
  io::Printer::Outdent(pPVar10);
  io::Printer::Print(pPVar10,"}\n");
  io::Printer::Outdent(pPVar10);
  io::Printer::Print(pPVar10,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateMergingMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  map<string, string> vars;
  vars["class_name"] = class_name();

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public void MergeFrom($class_name$ other) {\n");
  printer->Indent();
  printer->Print(
    "if (other == null) {\n"
    "  return;\n"
    "}\n");
  // Merge non-oneof fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {      
      scoped_ptr<FieldGeneratorBase> generator(
          CreateFieldGeneratorInternal(descriptor_->field(i)));
      generator->GenerateMergingCode(printer);
    }
  }
  // Merge oneof fields
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
        vars,
        "case $property_name$OneofCase.$field_property_name$:\n"
        "  $field_property_name$ = other.$field_property_name$;\n"
        "  break;\n");
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
  printer->Outdent();
  printer->Print("}\n\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void MergeFrom(pb::CodedInputStream input) {\n");
  printer->Indent();
  printer->Print(
    "uint tag;\n"
    "while ((tag = input.ReadTag()) != 0) {\n"
    "  switch(tag) {\n");
  printer->Indent();
  printer->Indent();
  // Option messages need to store unknown fields so that options can be parsed later.
  if (IsDescriptorOptionMessage(descriptor_)) {
	printer->Print(
      "default:\n"
      "  CustomOptions = CustomOptions.ReadOrSkipUnknownField(input);\n"
      "  break;\n");
  } else {
    printer->Print(
      "default:\n"
      "  input.SkipLastField();\n" // We're not storing the data, but we still need to consume it.
      "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32 tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array call;
    // the two generated cases are the packed and unpacked tags.
    // TODO(jonskeet): Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print(
        "case $packed_tag$:\n",
        "packed_tag",
        SimpleItoa(
            internal::WireFormatLite::MakeTag(
                field->number(),
                internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", SimpleItoa(tag));
    printer->Indent();
    scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n"); // switch
  printer->Outdent();
  printer->Print("}\n"); // while
  printer->Outdent();
  printer->Print("}\n\n"); // method
}